

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_flm.cpp
# Opt level: O0

void __thiscall phoenix_flm_t::~phoenix_flm_t(phoenix_flm_t *this)

{
  phoenix_flm_t *this_local;
  
  ~phoenix_flm_t(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

phoenix_flm_t::~phoenix_flm_t() {
    _clean_up();
}